

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

void it_filter(DUMB_CLICK_REMOVER *cr,IT_FILTER_STATE *state,sample_t_conflict *dst,int32 pos,
              sample_t_conflict *src,int32 size,int step,int sampfreq,int cutoff,int resonance)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  
  iVar7 = state->currsample;
  iVar6 = state->prevsample;
  dVar1 = exp2((double)cutoff * -0.00016276041666666666 + -0.25);
  fVar10 = (float)((double)sampfreq * 0.0014468631190172304 * dVar1);
  dVar1 = exp((double)resonance * -0.021586735246781247);
  fVar11 = (1.0 - (float)dVar1) / fVar10;
  if (2.0 <= fVar11) {
    fVar11 = 2.0;
  }
  fVar11 = 1.0 / (fVar10 * fVar10 + 1.0 + ((float)dVar1 - fVar11) * fVar10);
  fVar10 = -(fVar10 * fVar10) * fVar11;
  uVar5 = step * size;
  lVar8 = (long)(int)(fVar11 * 2.6843546e+08);
  lVar2 = (long)(int)(2.6843546e+08 - (fVar10 + fVar11) * 2.6843546e+08);
  lVar3 = (long)(int)(fVar10 * 2.6843546e+08);
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dumb_record_click(cr,pos,(int)((ulong)((iVar6 << 4) * lVar3) >> 0x20) +
                             (int)((ulong)((*src << 4) * lVar8) >> 0x20) +
                             (int)((ulong)((iVar7 << 4) * lVar2) >> 0x20));
  }
  if (0 < (int)uVar5) {
    lVar4 = 0;
    iVar9 = iVar6;
    do {
      iVar6 = iVar7;
      iVar7 = (int)((ulong)((iVar9 << 4) * lVar3) >> 0x20) +
              (int)((ulong)((iVar6 << 4) * lVar2) >> 0x20) +
              (int)((ulong)((src[lVar4] << 4) * lVar8) >> 0x20);
      dst[step * pos + lVar4] = dst[step * pos + lVar4] + iVar7;
      lVar4 = lVar4 + step;
      iVar9 = iVar6;
    } while (lVar4 < (long)(ulong)uVar5);
  }
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dumb_record_click(cr,size + pos,
                      -((int)((ulong)((iVar6 << 4) * lVar3) >> 0x20) +
                        (int)((ulong)((src[(int)uVar5] << 4) * lVar8) >> 0x20) +
                       (int)((ulong)((iVar7 << 4) * lVar2) >> 0x20)));
  }
  state->currsample = iVar7;
  state->prevsample = iVar6;
  return;
}

Assistant:

static void it_filter(DUMB_CLICK_REMOVER *cr, IT_FILTER_STATE *state, sample_t *dst, int32 pos, sample_t *src, int32 size, int step, int sampfreq, int cutoff, int resonance)
{
#if defined(_USE_SSE) && (defined(_M_IX86) || defined(__i386__) || defined(_M_X64) || defined(__amd64__))
    _dumb_init_sse();
	if ( _dumb_it_use_sse ) it_filter_sse( cr, state, dst, pos, src, size, step, sampfreq, cutoff, resonance );
	else
#endif
	it_filter_int( cr, state, dst, pos, src, size, step, sampfreq, cutoff, resonance );
}